

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_set_covered(MultiFab *mf,int icomp,int ncomp,int ngrow,Real val)

{
  BATType BVar1;
  FabArray<amrex::FArrayBox> *this;
  long lVar2;
  long lVar3;
  long lVar4;
  uint32_t *puVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  MFIter mfi;
  uint local_21c;
  int local_1fc;
  ulong local_1f0;
  Box local_1bc;
  long local_1a0;
  Real local_198;
  ulong local_190;
  ulong local_188;
  long local_180;
  long local_178;
  FabArray<amrex::FArrayBox> *local_170;
  FabArray<amrex::EBCellFlagFab> *local_168;
  ulong local_160;
  long local_158;
  ulong local_150;
  long local_148;
  uint32_t *local_140;
  uint32_t *local_138;
  ulong local_130;
  long local_128;
  long local_120;
  EBCellFlag *local_118;
  Array4<double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter local_90;
  
  local_198 = val;
  lVar2 = __dynamic_cast((mf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo);
  if (lVar2 != 0) {
    local_168 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar2 + 0xd8));
    BVar1 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type;
    uVar7 = 0;
    switch(BVar1) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      uVar7 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
              m_indexType.m_typ.itype;
      break;
    default:
      uVar7 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
              m_bndryReg.m_typ.itype;
    }
    if (uVar7 != 0) {
      uVar7 = 0;
      switch(BVar1) {
      case null:
      case coarsenRatio:
        break;
      case indexType:
      case indexType_coarsenRatio:
        uVar7 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                m_indexType.m_typ.itype;
        break;
      default:
        uVar7 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ.itype;
      }
      if (uVar7 != 7) {
        Assert_host("mf.ixType().cellCentered() || mf.ixType().nodeCentered()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
                    ,0x21,(char *)0x0);
      }
    }
    local_21c = 0;
    switch((mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      local_21c = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                  m_indexType.m_typ.itype;
      break;
    default:
      local_21c = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                  m_bndryReg.m_typ.itype;
    }
    iVar10 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    if (iVar10 < ngrow) {
      ngrow = iVar10;
    }
    MFIter::MFIter(&local_90,(FabArrayBase *)mf,true);
    if (local_90.currentIndex < local_90.endIndex) {
      local_188 = (ulong)(uint)ncomp;
      local_1a0 = (long)icomp << 3;
      local_170 = &mf->super_FabArray<amrex::FArrayBox>;
      do {
        this = local_170;
        MFIter::growntilebox(&local_1bc,&local_90,ngrow);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_d0,local_168,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this,&local_90);
        if (local_21c == 0) {
          if (0 < ncomp) {
            uVar6 = 0;
            lVar2 = local_1a0;
            do {
              uVar7 = local_1bc.smallend.vect[2];
              if (local_1bc.smallend.vect[2] <= local_1bc.bigend.vect[2]) {
                do {
                  if (local_1bc.smallend.vect[1] <= local_1bc.bigend.vect[1]) {
                    puVar5 = (uint32_t *)
                             ((long)&local_d0.p
                                     [(long)local_1bc.smallend.vect[0] +
                                      (((long)(int)uVar7 - (long)local_d0.begin.z) *
                                       local_d0.kstride - (long)local_d0.begin.x)].flag +
                             ((long)local_1bc.smallend.vect[1] - (long)local_d0.begin.y) *
                             local_d0.jstride * 4);
                    lVar16 = (long)local_1bc.smallend.vect[1];
                    do {
                      if (local_1bc.smallend.vect[0] <= local_1bc.bigend.vect[0]) {
                        lVar4 = 0;
                        do {
                          if ((~puVar5[lVar4] & 3) == 0) {
                            *(Real *)((long)local_110.p +
                                     lVar4 * 8 +
                                     local_110.nstride * lVar2 +
                                     ((long)(int)uVar7 - (long)local_110.begin.z) *
                                     local_110.kstride * 8 +
                                     (lVar16 - local_110.begin.y) * local_110.jstride * 8 +
                                     (long)local_110.begin.x * -8 +
                                     (long)local_1bc.smallend.vect[0] * 8) = local_198;
                          }
                          lVar4 = lVar4 + 1;
                        } while ((local_1bc.bigend.vect[0] - local_1bc.smallend.vect[0]) + 1 !=
                                 (int)lVar4);
                      }
                      lVar16 = lVar16 + 1;
                      puVar5 = puVar5 + local_d0.jstride;
                    } while (local_1bc.bigend.vect[1] + 1U != (int)lVar16);
                  }
                  bVar17 = uVar7 != local_1bc.bigend.vect[2];
                  uVar7 = uVar7 + 1;
                } while (bVar17);
              }
              uVar6 = uVar6 + 1;
              lVar2 = lVar2 + 8;
            } while (uVar6 != local_188);
          }
        }
        else if (0 < ncomp) {
          local_190 = (ulong)(uint)local_1bc.smallend.vect[2];
          local_150 = (ulong)(uint)local_1bc.bigend.vect[1];
          local_180 = (long)local_1bc.smallend.vect[1];
          lVar2 = (long)local_1bc.smallend.vect[0];
          local_158 = lVar2 * 4;
          local_148 = lVar2 * 8;
          local_178 = local_1a0;
          uVar6 = 0;
          do {
            local_160 = uVar6;
            local_1fc = local_1bc.smallend.vect[2] - 1;
            local_1f0 = local_190;
            if (local_1bc.smallend.vect[2] <= local_1bc.bigend.vect[2]) {
              do {
                if (local_1bc.smallend.vect[1] <= local_1bc.bigend.vect[1]) {
                  lVar8 = (long)local_d0.begin.x;
                  local_128 = (long)local_d0.begin.y;
                  local_130 = (ulong)(uint)~local_d0.begin.y;
                  lVar13 = (int)(~local_d0.begin.z + (uint)local_1f0) * local_d0.kstride;
                  lVar3 = (int)((uint)local_1f0 - local_d0.begin.z) * local_d0.kstride;
                  local_118 = local_d0.p;
                  lVar11 = ((long)(int)(uint)local_1f0 - (long)local_d0.begin.z) *
                           local_d0.kstride * 4;
                  local_138 = (uint32_t *)((long)&local_d0.p[lVar2 - lVar8].flag + lVar11);
                  local_120 = local_d0.jstride;
                  lVar16 = local_d0.jstride * 4;
                  lVar4 = (long)(local_1fc - local_d0.begin.z) * local_d0.kstride * 4;
                  lVar12 = (local_180 - local_128) * lVar16;
                  iVar10 = (local_1bc.smallend.vect[1] + -1) - local_d0.begin.y;
                  local_140 = (uint32_t *)((long)&local_d0.p[lVar2 - lVar8].flag + lVar4);
                  lVar11 = (long)&local_d0.p[lVar2 - lVar8].flag + lVar11 + lVar12;
                  lVar8 = (long)&local_d0.p[lVar2 - lVar8].flag + lVar12 + lVar4;
                  lVar4 = local_180;
                  do {
                    if (local_1bc.smallend.vect[0] <= local_1bc.bigend.vect[0]) {
                      lVar12 = (~local_d0.begin.y + (int)lVar4) * local_d0.jstride;
                      lVar9 = (lVar4 - local_128) * local_d0.jstride;
                      lVar15 = 0;
                      do {
                        lVar14 = (long)(((local_1bc.smallend.vect[0] + -1) - local_d0.begin.x) +
                                       (int)lVar15);
                        if ((((((~local_d0.p[lVar12 + lVar14 + lVar13].flag & 3) == 0) &&
                              ((~*(uint *)((long)local_140 + lVar15 * 4 + iVar10 * lVar16) & 3) == 0
                              )) && ((~local_d0.p[lVar9 + lVar14 + lVar13].flag & 3) == 0)) &&
                            (((~*(uint *)(lVar8 + lVar15 * 4) & 3) == 0 &&
                             ((~local_d0.p[lVar12 + lVar14 + lVar3].flag & 3) == 0)))) &&
                           (((~*(uint *)((long)local_138 + lVar15 * 4 + iVar10 * lVar16) & 3) == 0
                            && (((~local_d0.p[lVar9 + lVar14 + lVar3].flag & 3) == 0 &&
                                ((~*(uint *)(lVar11 + lVar15 * 4) & 3) == 0)))))) {
                          *(Real *)((long)local_110.p +
                                   lVar15 * 8 +
                                   local_110.nstride * local_178 +
                                   ((long)(int)(uint)local_1f0 - (long)local_110.begin.z) *
                                   local_110.kstride * 8 +
                                   (lVar4 - local_110.begin.y) * local_110.jstride * 8 +
                                   (long)local_110.begin.x * -8 + local_148) = local_198;
                        }
                        lVar15 = lVar15 + 1;
                      } while ((local_1bc.bigend.vect[0] - local_1bc.smallend.vect[0]) + 1 !=
                               (int)lVar15);
                    }
                    lVar4 = lVar4 + 1;
                    iVar10 = iVar10 + 1;
                    lVar11 = lVar11 + lVar16;
                    lVar8 = lVar8 + lVar16;
                  } while (local_1bc.bigend.vect[1] + 1U != (int)lVar4);
                }
                bVar17 = (uint)local_1f0 != local_1bc.bigend.vect[2];
                local_1fc = local_1fc + 1;
                local_1f0 = (ulong)((uint)local_1f0 + 1);
              } while (bVar17);
            }
            local_178 = local_178 + 8;
            uVar6 = local_160 + 1;
          } while (local_160 + 1 != local_188);
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
  }
  return;
}

Assistant:

void
EB_set_covered (MultiFab& mf, int icomp, int ncomp, int ngrow, Real val)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory == nullptr) return;
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ALWAYS_ASSERT(mf.ixType().cellCentered() || mf.ixType().nodeCentered());
    bool is_cell_centered = mf.ixType().cellCentered();
    int ng = std::min(mf.nGrow(),ngrow);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        const auto& flagarr = flags.const_array(mfi);
        Array4<Real> const& arr = mf.array(mfi);

        if (is_cell_centered) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flagarr(i,j,k).isCovered()) {
                    arr(i,j,k,n+icomp) = val;
                }
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D (bx, ncomp, i, j, k, n,
            {
                eb_set_covered_nodes(i,j,k,n,icomp,arr,flagarr,val);
            });
        }
    }
}